

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sproto.c
# Opt level: O0

int decode_array(sproto_callback cb,sproto_arg *args,uint8_t *stream)

{
  uint32_t uVar1;
  int iVar2;
  uint8_t *stream_00;
  ulong local_60;
  uint64_t value_2;
  uint64_t value_1;
  uint64_t hi;
  uint64_t low;
  uint64_t value;
  int len;
  int i;
  int type;
  uint32_t sz;
  uint8_t *stream_local;
  sproto_arg *args_local;
  sproto_callback cb_local;
  
  _type = stream;
  stream_local = (uint8_t *)args;
  args_local = (sproto_arg *)cb;
  i = todword(stream);
  len = *(int *)(stream_local + 0x14);
  stream_00 = _type + 4;
  if (len == 0) {
    if (i == 0) {
      return -1;
    }
    _type = _type + 5;
    i = i - 1;
    if (*stream_00 == '\x04') {
      if ((i & 3U) != 0) {
        return -1;
      }
      len = 0;
      value._0_4_ = 4;
      for (value._4_4_ = 0; (ulong)(long)(int)value._4_4_ < (ulong)((uint)i >> 2);
          value._4_4_ = value._4_4_ + 1) {
        uVar1 = todword(_type + (long)(int)value._4_4_ * 4);
        low = expand64(uVar1);
        *(uint *)(stream_local + 0x2c) = value._4_4_ + 1;
        *(uint64_t **)(stream_local + 0x20) = &low;
        stream_local[0x28] = '\b';
        stream_local[0x29] = '\0';
        stream_local[0x2a] = '\0';
        stream_local[0x2b] = '\0';
        (*(code *)args_local)(stream_local);
      }
    }
    else {
      if (*stream_00 != '\b') {
        return -1;
      }
      if ((i & 7U) != 0) {
        return -1;
      }
      len = 0;
      value._0_4_ = 8;
      for (value._4_4_ = 0; (ulong)(long)(int)value._4_4_ < (ulong)((uint)i >> 3);
          value._4_4_ = value._4_4_ + 1) {
        uVar1 = todword(_type + (long)(int)value._4_4_ * 8);
        hi = (uint64_t)uVar1;
        uVar1 = todword(_type + (long)(int)value._4_4_ * 8 + 4);
        value_1 = (uint64_t)uVar1;
        value_2 = hi | value_1 << 0x20;
        *(uint *)(stream_local + 0x2c) = value._4_4_ + 1;
        *(uint64_t **)(stream_local + 0x20) = &value_2;
        stream_local[0x28] = '\b';
        stream_local[0x29] = '\0';
        stream_local[0x2a] = '\0';
        stream_local[0x2b] = '\0';
        (*(code *)args_local)(stream_local);
      }
    }
  }
  else {
    _type = stream_00;
    if (len != 1) {
      if (1 < len - 2U) {
        return -1;
      }
      iVar2 = decode_array_object((sproto_callback)args_local,(sproto_arg *)stream_local,stream_00,i
                                 );
      return iVar2;
    }
    len = 1;
    for (value._4_4_ = 0; value._4_4_ < (uint)i; value._4_4_ = value._4_4_ + 1) {
      local_60 = (ulong)_type[(int)value._4_4_];
      *(uint *)(stream_local + 0x2c) = value._4_4_ + 1;
      *(ulong **)(stream_local + 0x20) = &local_60;
      stream_local[0x28] = '\b';
      stream_local[0x29] = '\0';
      stream_local[0x2a] = '\0';
      stream_local[0x2b] = '\0';
      (*(code *)args_local)(stream_local);
    }
  }
  return 0;
}

Assistant:

static int
decode_array(sproto_callback cb, struct sproto_arg *args, uint8_t * stream) {
	uint32_t sz = todword(stream);
	int type = args->type;
	int i;
	stream += SIZEOF_LENGTH;
	switch (type) {
	case SPROTO_TINTEGER: {
		int len;
		if (sz < 1)
			return -1;
		len = *stream;
		++stream;
		--sz;
		if (len == sizeof(uint32_t)) {
			if (sz % sizeof(uint32_t) != 0)
				return -1;
			for (i=0;i<sz/sizeof(uint32_t);i++) {
				uint64_t value = expand64(todword(stream + i*sizeof(uint32_t)));
				args->index = i+1;
				args->value = &value;
				args->length = sizeof(value);
				cb(args);
			}
		} else if (len == sizeof(uint64_t)) {
			if (sz % sizeof(uint64_t) != 0)
				return -1;
			for (i=0;i<sz/sizeof(uint64_t);i++) {
				uint64_t low = todword(stream + i*sizeof(uint64_t));
				uint64_t hi = todword(stream + i*sizeof(uint64_t) + sizeof(uint32_t));
				uint64_t value = low | hi << 32;
				args->index = i+1;
				args->value = &value;
				args->length = sizeof(value);
				cb(args);
			}
		} else {
			return -1;
		}
		break;
	}
	case SPROTO_TBOOLEAN:
		for (i=0;i<sz;i++) {
			uint64_t value = stream[i];
			args->index = i+1;
			args->value = &value;
			args->length = sizeof(value);
			cb(args);
		}
		break;
	case SPROTO_TSTRING:
	case SPROTO_TSTRUCT:
		return decode_array_object(cb, args, stream, sz);
	default:
		return -1;
	}
	return 0;
}